

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Aig_Man_t * Abc_NtkToDarBmc(Abc_Ntk_t *pNtk,Vec_Int_t **pvMap)

{
  ulong *puVar1;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  void *pvVar5;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar6;
  long lVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  uint *__ptr;
  void *pvVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  Aig_Man_t *p;
  char *pcVar15;
  Abc_Obj_t *pAVar16;
  Aig_Obj_t *pAVar17;
  int iVar18;
  ulong uVar19;
  Abc_Ntk_t *pAVar20;
  Aig_Man_t *pAVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  
  pVVar9 = pNtk->vBoxes;
  if (pVVar9->nSize < 1) {
    iVar18 = 0;
  }
  else {
    lVar8 = 0;
    iVar18 = 0;
    do {
      pvVar11 = pVVar9->pArray[lVar8];
      if (((*(uint *)((long)pvVar11 + 0x14) & 0xf) == 8) && (*(long *)((long)pvVar11 + 0x38) == 3))
      {
        *(undefined8 *)((long)pvVar11 + 0x38) = 1;
        iVar18 = iVar18 + 1;
      }
      lVar8 = lVar8 + 1;
      pVVar9 = pNtk->vBoxes;
    } while (lVar8 < pVVar9->nSize);
  }
  if (iVar18 != 0) {
    pAVar20 = pNtk;
    Abc_Print((int)pNtk,"Warning: %d registers in this network have don\'t-care init values.\n");
    iVar18 = (int)pAVar20;
    Abc_Print(iVar18,"The don\'t-care are assumed to be 0. The result may not verify.\n");
    Abc_Print(iVar18,"Use command \"print_latch\" to see the init values of registers.\n");
    Abc_Print(iVar18,"Use command \"zero\" to convert or \"init\" to change the values.\n");
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar11 = malloc(800);
  *(void **)(__ptr + 2) = pvVar11;
  if (pvMap != (Vec_Int_t **)0x0) {
    pVVar12 = (Vec_Int_t *)malloc(0x10);
    pVVar12->nCap = 100;
    pVVar12->nSize = 0;
    piVar13 = (int *)malloc(400);
    pVVar12->pArray = piVar13;
    *pvMap = pVVar12;
  }
  pVVar14 = pNtk->vPos;
  if (0 < pVVar14->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pVVar14->pArray[lVar8];
      uVar4 = *(ulong *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
      uVar19 = (ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1);
      if (lVar8 < pNtk->nConstrs || (long)pNtk->nConstrs == 0) {
        Abc_CollectTopOr((Abc_Obj_t *)(uVar19 ^ uVar4),pVVar9);
        if (0 < pVVar9->nSize) {
          uVar22 = *__ptr;
          uVar2 = __ptr[1];
          pvVar11 = *(void **)(__ptr + 2);
          lVar24 = 0;
          do {
            pvVar5 = pVVar9->pArray[lVar24];
            if (uVar2 + (int)lVar24 == uVar22) {
              if ((int)uVar22 < 0x10) {
                if (pvVar11 == (void *)0x0) {
                  pvVar11 = malloc(0x80);
                }
                else {
                  pvVar11 = realloc(pvVar11,0x80);
                }
                uVar22 = 0x10;
              }
              else {
                uVar23 = uVar22 * 2;
                if (SBORROW4(uVar22,uVar23) != 0 < (int)uVar22) {
                  uVar22 = uVar23;
                  if (pvVar11 == (void *)0x0) {
                    pvVar11 = malloc((ulong)uVar23 << 3);
                  }
                  else {
                    pvVar11 = realloc(pvVar11,(ulong)uVar23 << 3);
                  }
                }
              }
            }
            *(void **)((long)pvVar11 + lVar24 * 8 + (long)(int)uVar2 * 8) = pvVar5;
            if (pvMap != (Vec_Int_t **)0x0) {
              Vec_IntPush(*pvMap,(int)lVar8);
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < pVVar9->nSize);
          __ptr[1] = uVar2 + (int)lVar24;
          *__ptr = uVar22;
          *(void **)(__ptr + 2) = pvVar11;
        }
      }
      else {
        uVar22 = __ptr[1];
        uVar2 = *__ptr;
        if (uVar22 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc(0x80);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar23 = 0x10;
          }
          else {
            uVar23 = uVar2 * 2;
            if ((int)uVar23 <= (int)uVar2) goto LAB_002a2c14;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar11;
          *__ptr = uVar23;
        }
LAB_002a2c14:
        __ptr[1] = uVar22 + 1;
        *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar22 * 8) = uVar4 ^ uVar19 ^ 1;
        if (pvMap != (Vec_Int_t **)0x0) {
          Vec_IntPush(*pvMap,(int)lVar8);
        }
      }
      lVar8 = lVar8 + 1;
      pVVar14 = pNtk->vPos;
    } while (lVar8 < pVVar14->nSize);
  }
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (void **)0x0;
  }
  free(pVVar9);
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = pNtk->nBarBufs;
  pcVar15 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar15;
  pcVar15 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar15;
  aVar6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar16 = Abc_AigConst1(pNtk);
  pAVar16->field_6 = aVar6;
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      pvVar11 = pVVar9->pArray[lVar8];
      pAVar17 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar11 + 0x40) = pAVar17;
      lVar8 = lVar8 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar8 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vBoxes;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar8];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        puVar1 = (ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[6] * 8) + 0x40);
        *puVar1 = *puVar1 ^ (ulong)(plVar3[7] == 2);
      }
      lVar8 = lVar8 + 1;
      pVVar9 = pNtk->vBoxes;
    } while (lVar8 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar8];
      if ((plVar3 != (long *)0x0) && (uVar22 = *(uint *)((long)plVar3 + 0x14), (uVar22 & 0xf) == 7))
      {
        lVar24 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
        pAVar17 = Aig_And(p,(Aig_Obj_t *)
                            ((ulong)(uVar22 >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar24 + (long)*(int *)plVar3[4] * 8) + 0x40)),
                          (Aig_Obj_t *)
                          ((ulong)(uVar22 >> 0xb & 1) ^
                          *(ulong *)(*(long *)(lVar24 + (long)((int *)plVar3[4])[1] * 8) + 0x40)));
        plVar3[8] = (long)pAVar17;
      }
      lVar8 = lVar8 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar8 < pVVar9->nSize);
  }
  uVar22 = __ptr[1];
  if (0 < (long)(int)uVar22) {
    lVar8 = *(long *)(__ptr + 2);
    lVar24 = 0;
    do {
      uVar4 = *(ulong *)(lVar8 + lVar24 * 8);
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)((uint)uVar4 & 1) ^ *(ulong *)((uVar4 & 0xfffffffffffffffe) + 0x40)
                        ^ 1));
      lVar24 = lVar24 + 1;
    } while ((int)uVar22 != lVar24);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  pVVar9 = pNtk->vBoxes;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar8];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        lVar24 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
        lVar7 = *(long *)(lVar24 + (long)*(int *)plVar3[6] * 8);
        if ((*(uint *)(lVar7 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        Aig_ObjCreateCo(p,(Aig_Obj_t *)
                          ((ulong)(*(long *)(lVar7 + 0x38) == 2) ^
                          (ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar24 + (long)*(int *)plVar3[4] * 8) + 0x40)));
      }
      lVar8 = lVar8 + 1;
      pVVar9 = pNtk->vBoxes;
    } while (lVar8 < pVVar9->nSize);
  }
  Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
  Aig_ManCleanup(p);
  pAVar21 = p;
  iVar18 = Aig_ManCheck(p);
  if (iVar18 == 0) {
    Abc_Print((int)pAVar21,"Abc_NtkToDarBmc: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDarBmc( Abc_Ntk_t * pNtk, Vec_Int_t ** pvMap )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pTemp;
    Vec_Ptr_t * vDrivers;
    Vec_Ptr_t * vSuper;
    int i, k, nDontCares;

    // print warning about initial values
    nDontCares = 0;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Abc_LatchSetInit0(pObj);
            nDontCares++;
        }
    if ( nDontCares )
    {
        Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
        Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
        Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
        Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
    }

    // collect the drivers
    vSuper   = Vec_PtrAlloc( 100 );
    vDrivers = Vec_PtrAlloc( 100 );
    if ( pvMap ) 
    *pvMap   = Vec_IntAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( pNtk->nConstrs && i >= pNtk->nConstrs )
        {
            Vec_PtrPush( vDrivers, Abc_ObjNot(Abc_ObjChild0(pObj)) );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
            continue;
        }
        Abc_CollectTopOr( Abc_ObjChild0(pObj), vSuper );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pTemp, k )
        {
            Vec_PtrPush( vDrivers, pTemp );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
        }       
    }
    Vec_PtrFree( vSuper );

    // create network
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // create flops
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNotCond( Abc_ObjFanout0(pObj)->pCopy, Abc_LatchIsInit1(pObj) );
    // copy internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
    // create the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pTemp, k )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjRegular(pTemp)->pCopy, !Abc_ObjIsComplement(pTemp)) );
    Vec_PtrFree( vDrivers );
    // create flops
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjChild0Copy(pObj), Abc_LatchIsInit1(Abc_ObjFanout0(pObj))) );

    // remove dangling nodes
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    Aig_ManCleanup( pMan );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDarBmc: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}